

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O3

Cord __thiscall absl::lts_20240722::Cord::Subcord(Cord *this,size_t pos,size_t new_size)

{
  undefined4 uVar1;
  undefined8 uVar2;
  uint8_t uVar3;
  bool bVar4;
  ulong uVar5;
  Nonnull<cord_internal::CordRep_*> pCVar6;
  undefined8 extraout_RAX;
  Nonnull<cord_internal::CordRep_*> in_RCX;
  Nonnull<cord_internal::CordRep_*> pCVar7;
  Nonnull<cord_internal::CordRep_*> pCVar8;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *puVar9;
  uint *extraout_RDX_01;
  long lVar10;
  Nonnull<cord_internal::CordRep_*> pCVar11;
  Nonnull<cord_internal::CordRep_*> n;
  Cord CVar12;
  ChunkIterator it;
  ChunkIterator local_c8;
  
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  uVar5 = (ulong)(char)*(byte *)pos;
  if ((uVar5 & 1) == 0) {
    pCVar11 = (Nonnull<cord_internal::CordRep_*>)(uVar5 >> 1);
    puVar9 = (uint *)new_size;
  }
  else {
    puVar9 = *(uint **)(pos + 8);
    pCVar11 = *(Nonnull<cord_internal::CordRep_*> *)puVar9;
  }
  if (pCVar11 < new_size) {
    new_size = (size_t)pCVar11;
  }
  n = (Nonnull<cord_internal::CordRep_*>)((long)pCVar11 - new_size);
  if (in_RCX <= (Nonnull<cord_internal::CordRep_*>)((long)pCVar11 - new_size)) {
    n = in_RCX;
  }
  if (n != (Nonnull<cord_internal::CordRep_*>)0x0) {
    pCVar11 = *(Nonnull<cord_internal::CordRep_*> *)(pos + 8);
    if (pCVar11 == (Nonnull<cord_internal::CordRep_*>)0x0 || (*(byte *)pos & 1) == 0) {
      lVar10 = 0;
      if ((uVar5 & 1) == 0) {
        lVar10 = pos + 1;
      }
      cord_internal::InlineData::set_inline_data
                ((InlineData *)this,
                 (char *)(((Nonnull<cord_internal::CordRep_*>)new_size)->storage + lVar10 + -0xd),
                 (size_t)n);
      puVar9 = extraout_RDX;
    }
    else {
      if (n < (Nonnull<cord_internal::CordRep_*>)0x10) {
        (this->contents_).data_.rep_.field_0.data[0] = (char)n * '\x02';
        local_c8.current_leaf_ = (Nullable<absl::cord_internal::CordRep_*>)0x0;
        local_c8.current_chunk_ = (string_view)ZEXT816(0);
        local_c8.btree_reader_.remaining_ = 0;
        local_c8.btree_reader_.navigator_.height_ = -1;
        local_c8.bytes_remaining_ = pCVar11->length;
        if ((Nonnull<cord_internal::CordRep_*>)local_c8.bytes_remaining_ ==
            (Nonnull<cord_internal::CordRep_*>)0x0) {
          local_c8.current_chunk_ = (string_view)ZEXT816(0);
          pCVar6 = (Nonnull<cord_internal::CordRep_*>)0x0;
        }
        else {
          ChunkIterator::InitTree(&local_c8,pCVar11);
          pCVar6 = (Nonnull<cord_internal::CordRep_*>)local_c8.bytes_remaining_;
        }
        if (pCVar6 < new_size) {
          __assert_fail("bytes_remaining_ >= n",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                        ,0x647,"void absl::Cord::ChunkIterator::AdvanceBytes(size_t)");
        }
        if (local_c8.current_chunk_._M_len < new_size ||
            local_c8.current_chunk_._M_len - new_size == 0) {
          pCVar7 = pCVar6;
          if ((Nonnull<cord_internal::CordRep_*>)new_size != (Nonnull<cord_internal::CordRep_*>)0x0)
          {
            if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
               (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_]
                == (CordRepBtree *)0x0)) {
              local_c8.bytes_remaining_ = 0;
              Subcord();
              ~Cord(this);
              _Unwind_Resume(extraout_RAX);
            }
            pCVar11 = (Nonnull<cord_internal::CordRep_*>)new_size;
            ChunkIterator::AdvanceBytesBtree(&local_c8,new_size);
            pCVar7 = (Nonnull<cord_internal::CordRep_*>)local_c8.bytes_remaining_;
          }
        }
        else {
          local_c8.current_chunk_._M_str = local_c8.current_chunk_._M_str + new_size;
          local_c8.current_chunk_._M_len = local_c8.current_chunk_._M_len - new_size;
          pCVar7 = (Nonnull<cord_internal::CordRep_*>)((long)pCVar6 - new_size);
          local_c8.bytes_remaining_ = (long)pCVar6 - new_size;
        }
        if (pCVar7 != (Nonnull<cord_internal::CordRep_*>)0x0) {
          pos = (size_t)((this->contents_).data_.rep_.field_0.data + 1);
          new_size = (size_t)&local_c8.btree_reader_;
          pCVar6 = (Nonnull<cord_internal::CordRep_*>)local_c8.current_chunk_._M_len;
          do {
            pCVar11 = n;
            n = (Nonnull<cord_internal::CordRep_*>)((long)pCVar11 - (long)pCVar6);
            if (pCVar11 < pCVar6 || n == (Nonnull<cord_internal::CordRep_*>)0x0) {
              puVar9 = (uint *)local_c8.current_chunk_._M_str;
              if (pCVar11 < (Nonnull<cord_internal::CordRep_*>)0x8) {
                if (pCVar11 < (Nonnull<cord_internal::CordRep_*>)0x4) {
                  if (pCVar11 != (Nonnull<cord_internal::CordRep_*>)0x0) {
                    *(char *)pos = *local_c8.current_chunk_._M_str;
                    *(uint8_t *)(pos + ((ulong)pCVar11 >> 1)) =
                         *(uint8_t *)((long)local_c8.current_chunk_._M_str + ((ulong)pCVar11 >> 1));
                    pCVar11[-1].storage[(long)(pos + 2)] =
                         *(uint8_t *)
                          ((long)local_c8.current_chunk_._M_str + (long)(pCVar11[-1].storage + 2));
                  }
                }
                else {
                  uVar1 = *(undefined4 *)
                           ((long)((long)local_c8.current_chunk_._M_str + -4) + (long)pCVar11);
                  *(uint *)pos = *(uint *)local_c8.current_chunk_._M_str;
                  *(undefined4 *)(&pCVar11[-1].tag + pos) = uVar1;
                }
              }
              else {
                if ((Nonnull<cord_internal::CordRep_*>)0xf < pCVar11) {
LAB_0010d028:
                  __assert_fail("n <= 15",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                                ,0x60,
                                "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = false]"
                               );
                }
                uVar2 = *(undefined8 *)
                         ((long)((long)local_c8.current_chunk_._M_str + -8) + (long)pCVar11);
                *(undefined8 *)pos = *(undefined8 *)local_c8.current_chunk_._M_str;
                *(undefined8 *)(pos + (long)&pCVar11[-1].refcount.count_.super___atomic_base<int>) =
                     uVar2;
              }
              goto LAB_0010cf75;
            }
            if (pCVar6 < (Nonnull<cord_internal::CordRep_*>)0x8) {
              if (pCVar6 < (Nonnull<cord_internal::CordRep_*>)0x4) {
                if (pCVar6 != (Nonnull<cord_internal::CordRep_*>)0x0) {
                  *(char *)pos = *local_c8.current_chunk_._M_str;
                  pCVar11 = (Nonnull<cord_internal::CordRep_*>)((ulong)pCVar6 >> 1);
                  ((CordRep *)(pCVar11->storage + -0xd))->storage[(long)(pos + -0xd)] =
                       *(uint8_t *)((long)local_c8.current_chunk_._M_str + (long)pCVar11);
                  pCVar6[-1].storage[(long)(pos + 2)] =
                       *(uint8_t *)
                        ((long)local_c8.current_chunk_._M_str + (long)(pCVar6[-1].storage + 2));
                }
              }
              else {
                pCVar11 = (Nonnull<cord_internal::CordRep_*>)
                          (ulong)*(uint *)local_c8.current_chunk_._M_str;
                uVar1 = *(undefined4 *)
                         ((long)((long)local_c8.current_chunk_._M_str + -4) + (long)pCVar6);
                *(uint *)pos = *(uint *)local_c8.current_chunk_._M_str;
                *(undefined4 *)(&pCVar6[-1].tag + pos) = uVar1;
              }
            }
            else {
              if ((Nonnull<cord_internal::CordRep_*>)0xf < pCVar6) goto LAB_0010d028;
              pCVar11 = *(Nonnull<cord_internal::CordRep_*> *)local_c8.current_chunk_._M_str;
              uVar2 = *(undefined8 *)
                       ((long)((long)local_c8.current_chunk_._M_str + -8) + (long)pCVar6);
              *(Nonnull<cord_internal::CordRep_*> *)pos = pCVar11;
              *(undefined8 *)(pos + (long)&pCVar6[-1].refcount.count_.super___atomic_base<int>) =
                   uVar2;
            }
            pos = (size_t)(((CordRep *)(pCVar6->storage + -0xd))->storage + (long)(pos + -0xd));
            pCVar8 = (Nonnull<cord_internal::CordRep_*>)((long)pCVar7 - (long)pCVar6);
            if (pCVar7 < pCVar6) {
              __assert_fail("bytes_remaining_ >= current_chunk_.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                            ,0x61b,"Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
            }
            local_c8.bytes_remaining_ = (size_t)pCVar8;
            if (pCVar8 != (Nonnull<cord_internal::CordRep_*>)0x0) {
              if (((long)local_c8.btree_reader_.navigator_.height_ < 0) ||
                 (local_c8.btree_reader_.navigator_.node_[local_c8.btree_reader_.navigator_.height_]
                  == (CordRepBtree *)0x0)) {
                if (pCVar6 == (Nonnull<cord_internal::CordRep_*>)0x0) {
                  __assert_fail("!current_chunk_.empty()",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/cord.h"
                                ,0x621,
                                "Cord::ChunkIterator &absl::Cord::ChunkIterator::operator++()");
                }
                local_c8.current_chunk_ = (string_view)ZEXT816(0);
                pCVar6 = (Nonnull<cord_internal::CordRep_*>)0x0;
              }
              else {
                local_c8.current_chunk_ =
                     cord_internal::CordRepBtreeReader::Next((CordRepBtreeReader *)new_size);
                pCVar6 = (Nonnull<cord_internal::CordRep_*>)local_c8.current_chunk_._M_len;
              }
            }
            pCVar7 = (Nonnull<cord_internal::CordRep_*>)local_c8.bytes_remaining_;
          } while ((Nonnull<cord_internal::CordRep_*>)local_c8.bytes_remaining_ !=
                   (Nonnull<cord_internal::CordRep_*>)0x0);
        }
        Subcord();
      }
      uVar3 = pCVar11->tag;
      if (uVar3 == '\x02') {
        pCVar11 = (Nonnull<cord_internal::CordRep_*>)pCVar11[1].length;
        uVar3 = pCVar11->tag;
      }
      if (uVar3 == '\x03') {
        pCVar11 = (Nonnull<cord_internal::CordRep_*>)
                  absl::lts_20240722::cord_internal::CordRepBtree::SubTree((ulong)pCVar11,new_size);
      }
      else {
        pCVar6 = (Nonnull<cord_internal::CordRep_*>)pCVar11->length;
        if (pCVar6 <= new_size) {
          __assert_fail("pos < rep->length",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a3,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if ((Nonnull<cord_internal::CordRep_*>)((long)pCVar6 - new_size) < n) {
          __assert_fail("n <= rep->length - pos",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x1a4,
                        "static CordRep *absl::cord_internal::CordRepSubstring::Substring(CordRep *, size_t, size_t)"
                       );
        }
        if (pCVar6 == n) {
          LOCK();
          (pCVar11->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar11->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
        }
        else {
          pCVar6 = pCVar11;
          if (uVar3 == '\x01') {
            new_size = (size_t)(((Nonnull<cord_internal::CordRep_*>)new_size)->storage +
                               (pCVar11[1].length - 0xd));
            pCVar6 = *(Nonnull<cord_internal::CordRep_*> *)&pCVar11[1].refcount;
          }
          pCVar11 = (Nonnull<cord_internal::CordRep_*>)operator_new(0x20);
          pCVar11->length = 0;
          pCVar11->refcount = (atomic<int>)0x0;
          pCVar11->tag = '\0';
          pCVar11->storage[0] = '\0';
          pCVar11->storage[1] = '\0';
          pCVar11->storage[2] = '\0';
          (pCVar11->refcount).count_.super___atomic_base<int>._M_i = 2;
          pCVar11->length = (size_t)n;
          pCVar11->tag = '\x01';
          pCVar11[1].length = new_size;
          if (pCVar6 == (Nonnull<cord_internal::CordRep_*>)0x0) {
            __assert_fail("rep != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O3/_deps/absl-src/absl/strings/internal/cord_internal.h"
                          ,0x370,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)");
          }
          LOCK();
          (pCVar6->refcount).count_.super___atomic_base<int>._M_i =
               (pCVar6->refcount).count_.super___atomic_base<int>._M_i + 2;
          UNLOCK();
          *(Nonnull<cord_internal::CordRep_*> *)&pCVar11[1].refcount = pCVar6;
        }
      }
      (this->contents_).data_.rep_.field_0.as_tree.rep = pCVar11;
      (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 1;
      bVar4 = cord_internal::InlineData::is_either_profiled((InlineData *)this,(InlineData *)pos);
      puVar9 = extraout_RDX_00;
      if (bVar4) {
        absl::lts_20240722::cord_internal::CordzInfo::MaybeTrackCordImpl
                  ((InlineData *)this,(InlineData *)pos,kSubCord);
        puVar9 = extraout_RDX_01;
      }
    }
  }
LAB_0010cf75:
  CVar12.contents_.data_.rep_.field_0.as_tree.rep = (CordRep *)puVar9;
  CVar12.contents_.data_.rep_.field_0.as_tree.cordz_info = (cordz_info_t)this;
  return (Cord)CVar12.contents_.data_.rep_.field_0;
}

Assistant:

Cord Cord::Subcord(size_t pos, size_t new_size) const {
  Cord sub_cord;
  size_t length = size();
  if (pos > length) pos = length;
  if (new_size > length - pos) new_size = length - pos;
  if (new_size == 0) return sub_cord;

  CordRep* tree = contents_.tree();
  if (tree == nullptr) {
    sub_cord.contents_.set_data(contents_.data() + pos, new_size);
    return sub_cord;
  }

  if (new_size <= InlineRep::kMaxInline) {
    sub_cord.contents_.set_inline_size(new_size);
    char* dest = sub_cord.contents_.data_.as_chars();
    Cord::ChunkIterator it = chunk_begin();
    it.AdvanceBytes(pos);
    size_t remaining_size = new_size;
    while (remaining_size > it->size()) {
      cord_internal::SmallMemmove(dest, it->data(), it->size());
      remaining_size -= it->size();
      dest += it->size();
      ++it;
    }
    cord_internal::SmallMemmove(dest, it->data(), remaining_size);
    return sub_cord;
  }

  tree = cord_internal::SkipCrcNode(tree);
  if (tree->IsBtree()) {
    tree = tree->btree()->SubTree(pos, new_size);
  } else {
    tree = CordRepSubstring::Substring(tree, pos, new_size);
  }
  sub_cord.contents_.EmplaceTree(tree, contents_.data_,
                                 CordzUpdateTracker::kSubCord);
  return sub_cord;
}